

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O2

void guardAttack(UnitList *guardList,UnitList *inmateList)

{
  int *piVar1;
  _Bool _Var2;
  UnitNode *guard;
  UnitNode *inmate;
  
  if (guardList == (UnitList *)0x0) {
    guard = (UnitNode *)0x0;
  }
  else {
    guard = guardList->head;
  }
  if (inmateList == (UnitList *)0x0) {
    inmate = (UnitNode *)0x0;
  }
  else {
    inmate = inmateList->head;
  }
LAB_001042f7:
  do {
    _Var2 = inRange(inmate,guard);
    if (_Var2) {
      piVar1 = (int *)((long)inmate->unit + 8);
      *piVar1 = *piVar1 - *(int *)((long)guard->unit + 8);
LAB_00104319:
      inmate = inmate->next;
      if (inmate == (UnitNode *)0x0) goto LAB_0010432b;
      if (inmate->next != (UnitNode *)0x0) goto LAB_001042f7;
    }
    else {
      if (inmate != (UnitNode *)0x0) goto LAB_00104319;
LAB_0010432b:
      inmate = (UnitNode *)0x0;
    }
    if (((guard == (UnitNode *)0x0) || (guard = guard->next, guard == (UnitNode *)0x0)) ||
       (guard->next == (UnitNode *)0x0)) {
      return;
    }
  } while( true );
}

Assistant:

void guardAttack(struct UnitList *guardList, struct UnitList *inmateList) {
    struct UnitNode *nextInmate;
    struct UnitNode *nextGuard;

    nextGuard = getHead(guardList);
    nextInmate = getHead(inmateList);

    do {
        do {
            if (inRange(nextInmate, nextGuard))
                dealDamage(nextInmate, nextGuard);
            nextInmate = getNext(nextInmate);
        } while (getNext(nextInmate) != NULL);
        nextGuard = getNext(nextGuard);
    } while (getNext(nextGuard) != NULL);
}